

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O2

void cubic_on_lost(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t lost_pn,
                  uint64_t next_pn,int64_t now,uint32_t max_udp_payload_size)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  if (cc->recovery_end <= lost_pn) {
    cc->recovery_end = next_pn;
    cc->num_loss_episodes = cc->num_loss_episodes + 1;
    uVar2 = cc->cwnd;
    if (cc->cwnd_exiting_slow_start == 0) {
      cc->cwnd_exiting_slow_start = uVar2;
    }
    (cc->state).cubic.avoidance_start = now;
    dVar4 = (double)uVar2;
    (cc->state).cubic.w_max = uVar2;
    dVar3 = dVar4;
    if (uVar2 < (cc->state).cubic.w_last_max) {
      (cc->state).cubic.w_max = (uint32_t)(long)(dVar4 * 0.85);
      dVar3 = (double)((long)(dVar4 * 0.85) & 0xffffffff);
    }
    (cc->state).cubic.w_last_max = uVar2;
    dVar3 = cbrt((dVar3 / (double)max_udp_payload_size) * 0.7500000000000001);
    (cc->state).cubic.k = dVar3;
    uVar1 = (uint)(long)(dVar4 * 0.7);
    uVar2 = max_udp_payload_size * 2;
    if (max_udp_payload_size * 2 <= uVar1) {
      uVar2 = uVar1;
    }
    cc->cwnd = uVar2;
    cc->ssthresh = uVar2;
    if (uVar2 < cc->cwnd_minimum) {
      cc->cwnd_minimum = uVar2;
    }
  }
  return;
}

Assistant:

static void cubic_on_lost(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t lost_pn, uint64_t next_pn,
                          int64_t now, uint32_t max_udp_payload_size)
{
    /* Nothing to do if loss is in recovery window. */
    if (lost_pn < cc->recovery_end)
        return;
    cc->recovery_end = next_pn;

    ++cc->num_loss_episodes;
    if (cc->cwnd_exiting_slow_start == 0)
        cc->cwnd_exiting_slow_start = cc->cwnd;

    cc->state.cubic.avoidance_start = now;
    cc->state.cubic.w_max = cc->cwnd;

    /* RFC 8312, Section 4.6; Fast Convergence */
    /* w_last_max is initialized to zero; therefore this condition is false when exiting slow start */
    if (cc->state.cubic.w_max < cc->state.cubic.w_last_max) {
        cc->state.cubic.w_last_max = cc->state.cubic.w_max;
        cc->state.cubic.w_max *= (1.0 + QUICLY_CUBIC_BETA) / 2.0;
    } else {
        cc->state.cubic.w_last_max = cc->state.cubic.w_max;
    }
    update_cubic_k(cc, max_udp_payload_size);

    /* RFC 8312, Section 4.5; Multiplicative Decrease */
    cc->cwnd *= QUICLY_CUBIC_BETA;
    if (cc->cwnd < QUICLY_MIN_CWND * max_udp_payload_size)
        cc->cwnd = QUICLY_MIN_CWND * max_udp_payload_size;
    cc->ssthresh = cc->cwnd;

    if (cc->cwnd_minimum > cc->cwnd)
        cc->cwnd_minimum = cc->cwnd;
}